

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O3

CURLcode Curl_sasl_start(SASL *sasl,connectdata *conn,_Bool force_ir,saslprogress *progress)

{
  Curl_easy *data;
  ulong uVar1;
  uint uVar2;
  CURLcode CVar3;
  saslstate sVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  saslstate sVar8;
  SASLproto *pSVar9;
  char *resp;
  size_t len;
  char *local_58;
  size_t local_50;
  connectdata *local_48;
  saslstate local_3c;
  char *local_38;
  
  data = conn->data;
  CVar3 = CURLE_OK;
  local_58 = (char *)0x0;
  local_50 = 0;
  sasl->force_ir = force_ir;
  sasl->authused = 0;
  uVar2 = sasl->prefmech & sasl->authmechs;
  *progress = SASL_IDLE;
  if (((uVar2 & 0x20) != 0) && (*conn->passwd == '\0')) {
    sasl->authused = 0x20;
    if ((force_ir) || ((data->set).sasl_ir == true)) {
      CVar3 = Curl_auth_create_external_message(data,conn->user,&local_58,&local_50);
      sVar4 = SASL_FINAL;
      sVar8 = SASL_EXTERNAL;
      pcVar7 = "EXTERNAL";
      goto LAB_00141ebe;
    }
    sVar4 = SASL_FINAL;
    sVar8 = SASL_EXTERNAL;
    pcVar7 = "EXTERNAL";
    goto LAB_00141dc9;
  }
  if ((conn->bits).user_passwd != true) goto LAB_00141ecc;
  if ((uVar2 & 8) == 0) {
    if ((uVar2 & 4) != 0) {
      sVar8 = SASL_CRAMMD5;
      pcVar7 = "CRAM-MD5";
      uVar2 = 4;
      goto LAB_00141dbc;
    }
    if ((uVar2 & 0x40) != 0) {
      sasl->authused = 0x40;
      if ((force_ir) || ((data->set).sasl_ir == true)) {
        CVar3 = Curl_auth_create_ntlm_type1_message
                          (conn->user,conn->passwd,&conn->ntlm,&local_58,&local_50);
        sVar4 = SASL_NTLM_TYPE2MSG;
        sVar8 = SASL_NTLM;
        pcVar7 = "NTLM";
LAB_00141ebe:
        if (CVar3 != CURLE_OK) goto LAB_00141ecc;
      }
      else {
        sVar4 = SASL_NTLM_TYPE2MSG;
        sVar8 = SASL_NTLM;
        pcVar7 = "NTLM";
      }
      goto LAB_00141dc9;
    }
    if (((uVar2 >> 8 & 1) != 0) && (pcVar7 = conn->oauth_bearer, pcVar7 != (char *)0x0)) {
      sasl->authused = 0x100;
      if ((force_ir) || ((data->set).sasl_ir == true)) {
        CVar3 = Curl_auth_create_oauth_bearer_message
                          (data,conn->user,(conn->host).name,conn->port,pcVar7,&local_58,&local_50);
        sVar4 = SASL_OAUTH2_RESP;
        sVar8 = SASL_OAUTH2;
        pcVar7 = "OAUTHBEARER";
        goto LAB_00141ebe;
      }
      sVar4 = SASL_OAUTH2_RESP;
      sVar8 = SASL_OAUTH2;
      pcVar7 = "OAUTHBEARER";
      goto LAB_00141dc9;
    }
    if (((char)uVar2 < '\0') && (pcVar7 = conn->oauth_bearer, pcVar7 != (char *)0x0)) {
      sasl->authused = 0x80;
      if ((force_ir) || ((data->set).sasl_ir == true)) {
        CVar3 = Curl_auth_create_oauth_bearer_message
                          (data,conn->user,(char *)0x0,0,pcVar7,&local_58,&local_50);
        sVar4 = SASL_FINAL;
        sVar8 = SASL_OAUTH2;
        pcVar7 = "XOAUTH2";
        goto LAB_00141ebe;
      }
      sVar4 = SASL_FINAL;
      sVar8 = SASL_OAUTH2;
      pcVar7 = "XOAUTH2";
      goto LAB_00141dc9;
    }
    if ((uVar2 & 1) != 0) {
      sasl->authused = 1;
      if ((force_ir) || ((data->set).sasl_ir == true)) {
        CVar3 = Curl_auth_create_login_message(data,conn->user,&local_58,&local_50);
        sVar4 = SASL_LOGIN_PASSWD;
        sVar8 = SASL_LOGIN;
        pcVar7 = "LOGIN";
        goto LAB_00141ebe;
      }
      sVar4 = SASL_LOGIN_PASSWD;
      sVar8 = SASL_LOGIN;
      pcVar7 = "LOGIN";
      goto LAB_00141dc9;
    }
    if ((uVar2 & 2) != 0) {
      sasl->authused = 2;
      if ((force_ir) || ((data->set).sasl_ir == true)) {
        CVar3 = Curl_auth_create_plain_message(data,conn->user,conn->passwd,&local_58,&local_50);
        sVar4 = SASL_FINAL;
        sVar8 = SASL_PLAIN;
        pcVar7 = "PLAIN";
        goto LAB_00141ebe;
      }
      sVar4 = SASL_FINAL;
      sVar8 = SASL_PLAIN;
      pcVar7 = "PLAIN";
      goto LAB_00141dc9;
    }
  }
  else {
    sVar8 = SASL_DIGESTMD5;
    pcVar7 = "DIGEST-MD5";
    uVar2 = 8;
LAB_00141dbc:
    sasl->authused = uVar2;
    sVar4 = SASL_FINAL;
LAB_00141dc9:
    pcVar6 = local_58;
    pSVar9 = sasl->params;
    local_3c = sVar4;
    if (local_58 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      uVar1 = pSVar9->maxirlen;
      local_48 = conn;
      if ((uVar1 != 0) &&
         (local_38 = pcVar7, sVar5 = strlen(pcVar7), pcVar7 = local_38, conn = local_48,
         uVar1 < sVar5 + local_50)) {
        (*Curl_cfree)(pcVar6);
        local_58 = (char *)0x0;
        pSVar9 = sasl->params;
        pcVar6 = (char *)0x0;
        pcVar7 = local_38;
        conn = local_48;
      }
    }
    CVar3 = (*pSVar9->sendauth)(conn,pcVar7,pcVar6);
    if (CVar3 != CURLE_OK) goto LAB_00141ecc;
    *progress = SASL_INPROGRESS;
    sVar4 = local_3c;
    if (local_58 == (char *)0x0) {
      sVar4 = sVar8;
    }
    sasl->state = sVar4;
  }
  CVar3 = CURLE_OK;
LAB_00141ecc:
  (*Curl_cfree)(local_58);
  return CVar3;
}

Assistant:

CURLcode Curl_sasl_start(struct SASL *sasl, struct connectdata *conn,
                         bool force_ir, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  unsigned int enabledmechs;
  const char *mech = NULL;
  char *resp = NULL;
  size_t len = 0;
  saslstate state1 = SASL_STOP;
  saslstate state2 = SASL_FINAL;
#if defined(USE_KERBEROS5)
  const char* service = data->set.str[STRING_SERVICE_NAME] ?
                        data->set.str[STRING_SERVICE_NAME] :
                        sasl->params->service;
#endif

  sasl->force_ir = force_ir;    /* Latch for future use */
  sasl->authused = 0;           /* No mechanism used yet */
  enabledmechs = sasl->authmechs & sasl->prefmech;
  *progress = SASL_IDLE;

  /* Calculate the supported authentication mechanism, by decreasing order of
     security, as well as the initial response where appropriate */
  if((enabledmechs & SASL_MECH_EXTERNAL) && !conn->passwd[0]) {
    mech = SASL_MECH_STRING_EXTERNAL;
    state1 = SASL_EXTERNAL;
    sasl->authused = SASL_MECH_EXTERNAL;

    if(force_ir || data->set.sasl_ir)
      result = Curl_auth_create_external_message(data, conn->user, &resp,
                                                 &len);
  }
  else if(conn->bits.user_passwd) {
#if defined(USE_KERBEROS5)
    if(enabledmechs & SASL_MECH_GSSAPI) {
      sasl->mutual_auth = FALSE; /* TODO: Calculate mutual authentication */
      mech = SASL_MECH_STRING_GSSAPI;
      state1 = SASL_GSSAPI;
      state2 = SASL_GSSAPI_TOKEN;
      sasl->authused = SASL_MECH_GSSAPI;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_gssapi_user_message(data, conn->user,
                                                      conn->passwd,
                                                      service,
                                                      data->easy_conn->
                                                            host.name,
                                                      sasl->mutual_auth,
                                                      NULL, &conn->krb5,
                                                      &resp, &len);
    }
    else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
    if(enabledmechs & SASL_MECH_DIGEST_MD5) {
      mech = SASL_MECH_STRING_DIGEST_MD5;
      state1 = SASL_DIGESTMD5;
      sasl->authused = SASL_MECH_DIGEST_MD5;
    }
    else if(enabledmechs & SASL_MECH_CRAM_MD5) {
      mech = SASL_MECH_STRING_CRAM_MD5;
      state1 = SASL_CRAMMD5;
      sasl->authused = SASL_MECH_CRAM_MD5;
    }
    else
#endif
#ifdef USE_NTLM
    if(enabledmechs & SASL_MECH_NTLM) {
      mech = SASL_MECH_STRING_NTLM;
      state1 = SASL_NTLM;
      state2 = SASL_NTLM_TYPE2MSG;
      sasl->authused = SASL_MECH_NTLM;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_ntlm_type1_message(conn->user, conn->passwd,
                                                     &conn->ntlm, &resp, &len);
      }
    else
#endif
    if((enabledmechs & SASL_MECH_OAUTHBEARER) && conn->oauth_bearer) {
      mech = SASL_MECH_STRING_OAUTHBEARER;
      state1 = SASL_OAUTH2;
      state2 = SASL_OAUTH2_RESP;
      sasl->authused = SASL_MECH_OAUTHBEARER;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_oauth_bearer_message(data, conn->user,
                                                       conn->host.name,
                                                       conn->port,
                                                       conn->oauth_bearer,
                                                       &resp, &len);
    }
    else if((enabledmechs & SASL_MECH_XOAUTH2) && conn->oauth_bearer) {
      mech = SASL_MECH_STRING_XOAUTH2;
      state1 = SASL_OAUTH2;
      sasl->authused = SASL_MECH_XOAUTH2;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_oauth_bearer_message(data, conn->user,
                                                       NULL, 0,
                                                       conn->oauth_bearer,
                                                       &resp, &len);
    }
    else if(enabledmechs & SASL_MECH_LOGIN) {
      mech = SASL_MECH_STRING_LOGIN;
      state1 = SASL_LOGIN;
      state2 = SASL_LOGIN_PASSWD;
      sasl->authused = SASL_MECH_LOGIN;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_login_message(data, conn->user, &resp, &len);
    }
    else if(enabledmechs & SASL_MECH_PLAIN) {
      mech = SASL_MECH_STRING_PLAIN;
      state1 = SASL_PLAIN;
      sasl->authused = SASL_MECH_PLAIN;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_plain_message(data, conn->user, conn->passwd,
                                                &resp, &len);
    }
  }

  if(!result && mech) {
    if(resp && sasl->params->maxirlen &&
       strlen(mech) + len > sasl->params->maxirlen) {
      free(resp);
      resp = NULL;
    }

    result = sasl->params->sendauth(conn, mech, resp);
    if(!result) {
      *progress = SASL_INPROGRESS;
      state(sasl, conn, resp ? state2 : state1);
    }
  }

  free(resp);

  return result;
}